

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O1

UBool __thiscall
icu_63::CollationWeights::allocWeights
          (CollationWeights *this,uint32_t lowerLimit,uint32_t upperLimit,int32_t n)

{
  int minLength;
  UBool UVar1;
  long lVar2;
  int iVar3;
  WeightRange *range;
  
  UVar1 = getWeightRanges(this,lowerLimit,upperLimit);
  if (UVar1 != '\0') {
    do {
      minLength = this->ranges[0].length;
      UVar1 = allocWeightsInShortRanges(this,n,minLength);
      iVar3 = 2;
      if ((UVar1 == '\0') && (iVar3 = 1, minLength != 4)) {
        UVar1 = allocWeightsInMinLengthRanges(this,n,minLength);
        iVar3 = 2;
        if ((UVar1 == '\0') && (iVar3 = 0, 0 < this->rangeCount)) {
          lVar2 = 0;
          range = this->ranges;
          do {
            if (range->length != minLength) break;
            lengthenRange(this,range);
            lVar2 = lVar2 + 1;
            range = range + 1;
          } while (lVar2 < this->rangeCount);
        }
      }
    } while (iVar3 == 0);
    if (iVar3 != 1) {
      this->rangeIndex = 0;
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

UBool
CollationWeights::allocWeights(uint32_t lowerLimit, uint32_t upperLimit, int32_t n) {
#ifdef UCOL_DEBUG
    puts("");
#endif

    if(!getWeightRanges(lowerLimit, upperLimit)) {
#ifdef UCOL_DEBUG
        printf("error: unable to get Weight ranges\n");
#endif
        return FALSE;
    }

    /* try until we find suitably large ranges */
    for(;;) {
        /* get the smallest number of bytes in a range */
        int32_t minLength=ranges[0].length;

        if(allocWeightsInShortRanges(n, minLength)) { break; }

        if(minLength == 4) {
#ifdef UCOL_DEBUG
            printf("error: the maximum number of %ld weights is insufficient for n=%ld\n",
                   minLengthCount, n);
#endif
            return FALSE;
        }

        if(allocWeightsInMinLengthRanges(n, minLength)) { break; }

        /* no good match, lengthen all minLength ranges and iterate */
#ifdef UCOL_DEBUG
        printf("lengthen the short ranges from %ld bytes to %ld and iterate\n", minLength, minLength+1);
#endif
        for(int32_t i=0; i<rangeCount && ranges[i].length==minLength; ++i) {
            lengthenRange(ranges[i]);
        }
    }

#ifdef UCOL_DEBUG
    puts("final ranges:");
    for(int32_t i=0; i<rangeCount; ++i) {
        printf("ranges[%ld] .start=0x%08lx .end=0x%08lx .length=%ld .count=%ld\n",
               i, ranges[i].start, ranges[i].end, ranges[i].length, ranges[i].count);
    }
#endif

    rangeIndex = 0;
    return TRUE;
}